

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_EXT_secondary_color(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_EXT_secondary_color != 0) {
    glad_glSecondaryColor3usEXT =
         (PFNGLSECONDARYCOLOR3USEXTPROC)(*load)("glSecondaryColor3usEXT",userptr);
    glad_glSecondaryColor3uiEXT =
         (PFNGLSECONDARYCOLOR3UIEXTPROC)(*load)("glSecondaryColor3uiEXT",userptr);
    glad_glSecondaryColor3bvEXT =
         (PFNGLSECONDARYCOLOR3BVEXTPROC)(*load)("glSecondaryColor3bvEXT",userptr);
    glad_glSecondaryColor3fv = (PFNGLSECONDARYCOLOR3FVPROC)(*load)("glSecondaryColor3fv",userptr);
    glad_glSecondaryColor3sEXT =
         (PFNGLSECONDARYCOLOR3SEXTPROC)(*load)("glSecondaryColor3sEXT",userptr);
    glad_glSecondaryColor3svEXT =
         (PFNGLSECONDARYCOLOR3SVEXTPROC)(*load)("glSecondaryColor3svEXT",userptr);
    glad_glSecondaryColor3iEXT =
         (PFNGLSECONDARYCOLOR3IEXTPROC)(*load)("glSecondaryColor3iEXT",userptr);
    glad_glSecondaryColor3uivEXT =
         (PFNGLSECONDARYCOLOR3UIVEXTPROC)(*load)("glSecondaryColor3uivEXT",userptr);
    glad_glSecondaryColorPointer =
         (PFNGLSECONDARYCOLORPOINTERPROC)(*load)("glSecondaryColorPointer",userptr);
    glad_glSecondaryColor3usvEXT =
         (PFNGLSECONDARYCOLOR3USVEXTPROC)(*load)("glSecondaryColor3usvEXT",userptr);
    glad_glSecondaryColor3us = (PFNGLSECONDARYCOLOR3USPROC)(*load)("glSecondaryColor3us",userptr);
    glad_glSecondaryColor3ubvEXT =
         (PFNGLSECONDARYCOLOR3UBVEXTPROC)(*load)("glSecondaryColor3ubvEXT",userptr);
    glad_glSecondaryColor3sv = (PFNGLSECONDARYCOLOR3SVPROC)(*load)("glSecondaryColor3sv",userptr);
    glad_glSecondaryColor3ubEXT =
         (PFNGLSECONDARYCOLOR3UBEXTPROC)(*load)("glSecondaryColor3ubEXT",userptr);
    glad_glSecondaryColor3uiv = (PFNGLSECONDARYCOLOR3UIVPROC)(*load)("glSecondaryColor3uiv",userptr)
    ;
    glad_glSecondaryColorPointerEXT =
         (PFNGLSECONDARYCOLORPOINTEREXTPROC)(*load)("glSecondaryColorPointerEXT",userptr);
    glad_glSecondaryColor3ub = (PFNGLSECONDARYCOLOR3UBPROC)(*load)("glSecondaryColor3ub",userptr);
    glad_glSecondaryColor3ui = (PFNGLSECONDARYCOLOR3UIPROC)(*load)("glSecondaryColor3ui",userptr);
    glad_glSecondaryColor3usv = (PFNGLSECONDARYCOLOR3USVPROC)(*load)("glSecondaryColor3usv",userptr)
    ;
    glad_glSecondaryColor3d = (PFNGLSECONDARYCOLOR3DPROC)(*load)("glSecondaryColor3d",userptr);
    glad_glSecondaryColor3f = (PFNGLSECONDARYCOLOR3FPROC)(*load)("glSecondaryColor3f",userptr);
    glad_glSecondaryColor3dEXT =
         (PFNGLSECONDARYCOLOR3DEXTPROC)(*load)("glSecondaryColor3dEXT",userptr);
    glad_glSecondaryColor3b = (PFNGLSECONDARYCOLOR3BPROC)(*load)("glSecondaryColor3b",userptr);
    glad_glSecondaryColor3i = (PFNGLSECONDARYCOLOR3IPROC)(*load)("glSecondaryColor3i",userptr);
    glad_glSecondaryColor3fvEXT =
         (PFNGLSECONDARYCOLOR3FVEXTPROC)(*load)("glSecondaryColor3fvEXT",userptr);
    glad_glSecondaryColor3ivEXT =
         (PFNGLSECONDARYCOLOR3IVEXTPROC)(*load)("glSecondaryColor3ivEXT",userptr);
    glad_glSecondaryColor3ubv = (PFNGLSECONDARYCOLOR3UBVPROC)(*load)("glSecondaryColor3ubv",userptr)
    ;
    glad_glSecondaryColor3s = (PFNGLSECONDARYCOLOR3SPROC)(*load)("glSecondaryColor3s",userptr);
    glad_glSecondaryColor3bv = (PFNGLSECONDARYCOLOR3BVPROC)(*load)("glSecondaryColor3bv",userptr);
    glad_glSecondaryColor3dv = (PFNGLSECONDARYCOLOR3DVPROC)(*load)("glSecondaryColor3dv",userptr);
    glad_glSecondaryColor3dvEXT =
         (PFNGLSECONDARYCOLOR3DVEXTPROC)(*load)("glSecondaryColor3dvEXT",userptr);
    glad_glSecondaryColor3bEXT =
         (PFNGLSECONDARYCOLOR3BEXTPROC)(*load)("glSecondaryColor3bEXT",userptr);
    glad_glSecondaryColor3fEXT =
         (PFNGLSECONDARYCOLOR3FEXTPROC)(*load)("glSecondaryColor3fEXT",userptr);
    glad_glSecondaryColor3iv = (PFNGLSECONDARYCOLOR3IVPROC)(*load)("glSecondaryColor3iv",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_EXT_secondary_color( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_EXT_secondary_color) return;
    glSecondaryColor3usEXT = (PFNGLSECONDARYCOLOR3USEXTPROC) load("glSecondaryColor3usEXT", userptr);
    glSecondaryColor3uiEXT = (PFNGLSECONDARYCOLOR3UIEXTPROC) load("glSecondaryColor3uiEXT", userptr);
    glSecondaryColor3bvEXT = (PFNGLSECONDARYCOLOR3BVEXTPROC) load("glSecondaryColor3bvEXT", userptr);
    glSecondaryColor3fv = (PFNGLSECONDARYCOLOR3FVPROC) load("glSecondaryColor3fv", userptr);
    glSecondaryColor3sEXT = (PFNGLSECONDARYCOLOR3SEXTPROC) load("glSecondaryColor3sEXT", userptr);
    glSecondaryColor3svEXT = (PFNGLSECONDARYCOLOR3SVEXTPROC) load("glSecondaryColor3svEXT", userptr);
    glSecondaryColor3iEXT = (PFNGLSECONDARYCOLOR3IEXTPROC) load("glSecondaryColor3iEXT", userptr);
    glSecondaryColor3uivEXT = (PFNGLSECONDARYCOLOR3UIVEXTPROC) load("glSecondaryColor3uivEXT", userptr);
    glSecondaryColorPointer = (PFNGLSECONDARYCOLORPOINTERPROC) load("glSecondaryColorPointer", userptr);
    glSecondaryColor3usvEXT = (PFNGLSECONDARYCOLOR3USVEXTPROC) load("glSecondaryColor3usvEXT", userptr);
    glSecondaryColor3us = (PFNGLSECONDARYCOLOR3USPROC) load("glSecondaryColor3us", userptr);
    glSecondaryColor3ubvEXT = (PFNGLSECONDARYCOLOR3UBVEXTPROC) load("glSecondaryColor3ubvEXT", userptr);
    glSecondaryColor3sv = (PFNGLSECONDARYCOLOR3SVPROC) load("glSecondaryColor3sv", userptr);
    glSecondaryColor3ubEXT = (PFNGLSECONDARYCOLOR3UBEXTPROC) load("glSecondaryColor3ubEXT", userptr);
    glSecondaryColor3uiv = (PFNGLSECONDARYCOLOR3UIVPROC) load("glSecondaryColor3uiv", userptr);
    glSecondaryColorPointerEXT = (PFNGLSECONDARYCOLORPOINTEREXTPROC) load("glSecondaryColorPointerEXT", userptr);
    glSecondaryColor3ub = (PFNGLSECONDARYCOLOR3UBPROC) load("glSecondaryColor3ub", userptr);
    glSecondaryColor3ui = (PFNGLSECONDARYCOLOR3UIPROC) load("glSecondaryColor3ui", userptr);
    glSecondaryColor3usv = (PFNGLSECONDARYCOLOR3USVPROC) load("glSecondaryColor3usv", userptr);
    glSecondaryColor3d = (PFNGLSECONDARYCOLOR3DPROC) load("glSecondaryColor3d", userptr);
    glSecondaryColor3f = (PFNGLSECONDARYCOLOR3FPROC) load("glSecondaryColor3f", userptr);
    glSecondaryColor3dEXT = (PFNGLSECONDARYCOLOR3DEXTPROC) load("glSecondaryColor3dEXT", userptr);
    glSecondaryColor3b = (PFNGLSECONDARYCOLOR3BPROC) load("glSecondaryColor3b", userptr);
    glSecondaryColor3i = (PFNGLSECONDARYCOLOR3IPROC) load("glSecondaryColor3i", userptr);
    glSecondaryColor3fvEXT = (PFNGLSECONDARYCOLOR3FVEXTPROC) load("glSecondaryColor3fvEXT", userptr);
    glSecondaryColor3ivEXT = (PFNGLSECONDARYCOLOR3IVEXTPROC) load("glSecondaryColor3ivEXT", userptr);
    glSecondaryColor3ubv = (PFNGLSECONDARYCOLOR3UBVPROC) load("glSecondaryColor3ubv", userptr);
    glSecondaryColor3s = (PFNGLSECONDARYCOLOR3SPROC) load("glSecondaryColor3s", userptr);
    glSecondaryColor3bv = (PFNGLSECONDARYCOLOR3BVPROC) load("glSecondaryColor3bv", userptr);
    glSecondaryColor3dv = (PFNGLSECONDARYCOLOR3DVPROC) load("glSecondaryColor3dv", userptr);
    glSecondaryColor3dvEXT = (PFNGLSECONDARYCOLOR3DVEXTPROC) load("glSecondaryColor3dvEXT", userptr);
    glSecondaryColor3bEXT = (PFNGLSECONDARYCOLOR3BEXTPROC) load("glSecondaryColor3bEXT", userptr);
    glSecondaryColor3fEXT = (PFNGLSECONDARYCOLOR3FEXTPROC) load("glSecondaryColor3fEXT", userptr);
    glSecondaryColor3iv = (PFNGLSECONDARYCOLOR3IVPROC) load("glSecondaryColor3iv", userptr);
}